

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

void SetPos(GmfMshSct *msh,int64_t pos)

{
  GmfMshSct *in_RSI;
  long in_RDI;
  int IntVal;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  if (*(int *)(in_RDI + 4) < 3) {
    RecWrd(in_RSI,(void *)CONCAT44((int)in_RSI,in_stack_ffffffffffffffe8));
  }
  else {
    RecDblWrd(in_RSI,(void *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  return;
}

Assistant:

static void SetPos(GmfMshSct *msh, int64_t pos)
{
   int IntVal;

   if(msh->ver >= 3)
      RecDblWrd(msh, (unsigned char*)&pos);
   else
   {
      IntVal = (int)pos;
      RecWrd(msh, (unsigned char*)&IntVal);
   }
}